

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markov-2.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  state_type sVar3;
  reference pvVar4;
  size_t sVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  result_type_conflict rVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar8;
  exception *excp;
  double sigma_6;
  double diff_6;
  uint i_6;
  uint t_6;
  vector<double,_std::allocator<double>_> accum_6;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc_3;
  double sigma_5;
  double diff_5;
  uint i_5;
  uint t_5;
  vector<double,_std::allocator<double>_> accum_5;
  double sigma_4;
  double diff_4;
  uint i_4;
  uint t_4;
  vector<double,_std::allocator<double>_> accum_4;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc_2;
  double sigma_3;
  double diff_3;
  uint i_3;
  uint t_3;
  vector<double,_std::allocator<double>_> accum_3;
  double sigma_2;
  double diff_2;
  uint i_2;
  uint t_2;
  vector<double,_std::allocator<double>_> accum_2;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc_1;
  double sigma_1;
  double diff_1;
  uint i_1;
  uint t_1;
  vector<double,_std::allocator<double>_> accum_1;
  double sigma;
  double diff;
  uint i;
  uint t;
  vector<double,_std::allocator<double>_> accum;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc;
  int x;
  double *w_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double total;
  double *w;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> weights;
  uniform_real_distribution<double> dist;
  engine_type eng;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe5c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe5d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffe5d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffe5e0;
  size_type in_stack_ffffffffffffe5e8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe5f0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe600;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe608;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe610;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe618;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe628;
  size_t in_stack_ffffffffffffe630;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe638;
  uint local_167c;
  uint local_1678;
  vector<double,_std::allocator<double>_> local_1668 [2];
  double local_1628;
  double local_1620;
  uint local_1614;
  uint local_1610;
  undefined8 local_1608;
  vector<double,_std::allocator<double>_> local_1600;
  double local_15e8;
  double local_15e0;
  uint local_15d4;
  uint local_15d0;
  undefined8 local_15c8;
  vector<double,_std::allocator<double>_> local_15c0 [2];
  double local_1580;
  double local_1578;
  uint local_156c;
  uint local_1568;
  undefined8 local_1560;
  vector<double,_std::allocator<double>_> local_1558;
  double local_1540;
  double local_1538;
  uint local_152c;
  uint local_1528;
  undefined8 local_1520;
  vector<double,_std::allocator<double>_> local_1518 [2];
  double local_14d8;
  double local_14d0;
  uint local_14c4;
  uint local_14c0;
  undefined8 local_14b8;
  vector<double,_std::allocator<double>_> local_14b0;
  double local_1498;
  double local_1490;
  uint local_1484;
  uint local_1480;
  undefined8 local_1478;
  vector<double,_std::allocator<double>_> local_1470 [2];
  int local_142c;
  reference local_1428;
  double *local_1420;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1418;
  vector<double,_std::allocator<double>_> *local_1410;
  double *local_1408;
  double *local_1400;
  double local_13f8;
  reference local_13f0;
  double *local_13e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_13e0;
  vector<double,_std::allocator<double>_> *local_13d8;
  vector<double,_std::allocator<double>_> local_13c8 [210];
  int local_4;
  
  local_4 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"number of bins = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"number of samples = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,10000000);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffe5d0,(result_type)in_stack_ffffffffffffe5c8);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)0x102411);
  std::allocator<double>::allocator((allocator<double> *)0x102428);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             (allocator_type *)in_stack_ffffffffffffe5e0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x102451);
  local_13d8 = local_13c8;
  local_13e0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  local_13e8 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe5d0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe5c8);
    if (!bVar1) break;
    local_13f0 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_13e0);
    rVar7 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)in_stack_ffffffffffffe5d0,
                       in_stack_ffffffffffffe5c8);
    *local_13f0 = rVar7 * 0.001 + 1.0;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_13e0);
  }
  local_1400 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  local_1408 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  local_13f8 = std::
               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                         (in_stack_ffffffffffffe5e0,in_stack_ffffffffffffe5d8,
                          (double)in_stack_ffffffffffffe5d0);
  std::operator<<((ostream *)&std::cout,"[weights]\n");
  local_1410 = local_13c8;
  local_1418._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  local_1420 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe5d0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe5c8);
    if (!bVar1) break;
    local_1428 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_1418);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_1428);
    std::operator<<(poVar2,' ');
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_1418);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_142c = 0;
  std::operator<<((ostream *)&std::cout,"[Metropolis]\n");
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
  ::markov<bcl::metropolis,std::vector<double,std::allocator<double>>>
            ((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)in_stack_ffffffffffffe5d0,(metropolis *)in_stack_ffffffffffffe5c8,
             (vector<double,_std::allocator<double>_> *)0x1026f4);
  local_1478 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x102717);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x102748);
  for (local_1480 = 0; local_1480 < 10000000; local_1480 = local_1480 + 1) {
    sVar3 = bcl::markov_impl<unsigned_long>::operator()
                      ((markov_impl<unsigned_long> *)in_stack_ffffffffffffe5d0,
                       (state_type)in_stack_ffffffffffffe5c8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)0x102781);
    local_142c = (int)sVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1470,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_1484 = 0; local_1484 < 2; local_1484 = local_1484 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_1484);
    pvVar6 = local_1470;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_1484);
    std::abs((int)pvVar6);
    local_1490 = extraout_XMM0_Qa;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1470,(ulong)local_1484);
    local_1498 = sqrt(*pvVar4);
    local_1498 = local_1498 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1484);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_1484);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1470,(ulong)local_1484);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1490);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1498);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1490 / local_1498);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::~markov((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
             *)0x102ae3);
  std::operator<<((ostream *)&std::cout,"[Metropolis (choose_next)]\n");
  local_14b8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x102b19);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x102b4a);
  for (local_14c0 = 0; local_14c0 < 10000000; local_14c0 = local_14c0 + 1) {
    sVar5 = bcl::metropolis::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (in_stack_ffffffffffffe610,(size_t)in_stack_ffffffffffffe608,
                       in_stack_ffffffffffffe600);
    local_142c = (int)sVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_14b0,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_14c4 = 0; local_14c4 < 2; local_14c4 = local_14c4 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_14c4);
    pvVar6 = &local_14b0;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_14c4);
    std::abs((int)pvVar6);
    local_14d0 = extraout_XMM0_Qa_00;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_14b0,(ulong)local_14c4)
    ;
    local_14d8 = sqrt(*pvVar4);
    local_14d8 = local_14d8 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14c4);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_14c4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_14b0,(ulong)local_14c4)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14d0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14d8);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14d0 / local_14d8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  std::operator<<((ostream *)&std::cout,"[heat bath]\n");
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
  ::markov<bcl::heatbath,std::vector<double,std::allocator<double>>>
            ((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)in_stack_ffffffffffffe5d0,(heatbath *)in_stack_ffffffffffffe5c8,
             (vector<double,_std::allocator<double>_> *)0x102f1c);
  local_1520 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x102f3f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x102f70);
  for (local_1528 = 0; local_1528 < 10000000; local_1528 = local_1528 + 1) {
    sVar3 = bcl::markov_impl<unsigned_long>::operator()
                      ((markov_impl<unsigned_long> *)in_stack_ffffffffffffe5d0,
                       (state_type)in_stack_ffffffffffffe5c8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)0x102fa9);
    local_142c = (int)sVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1518,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_152c = 0; local_152c < 2; local_152c = local_152c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_152c);
    pvVar6 = local_1518;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_152c);
    std::abs((int)pvVar6);
    local_1538 = extraout_XMM0_Qa_01;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1518,(ulong)local_152c);
    local_1540 = sqrt(*pvVar4);
    local_1540 = local_1540 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_152c);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_152c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1518,(ulong)local_152c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1538);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1540);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1538 / local_1540);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::~markov((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
             *)0x10330b);
  std::operator<<((ostream *)&std::cout,"[heat bath (choose_next)]\n");
  local_1560 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x103341);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x103372);
  for (local_1568 = 0; local_1568 < 10000000; local_1568 = local_1568 + 1) {
    sVar5 = bcl::heatbath::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (in_stack_ffffffffffffe618,(int)((ulong)in_stack_ffffffffffffe610 >> 0x20),
                       in_stack_ffffffffffffe608);
    local_142c = (int)sVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1558,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_156c = 0; local_156c < 2; local_156c = local_156c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_156c);
    pvVar6 = &local_1558;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_156c);
    std::abs((int)pvVar6);
    local_1578 = extraout_XMM0_Qa_02;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1558,(ulong)local_156c)
    ;
    local_1580 = sqrt(*pvVar4);
    local_1580 = local_1580 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_156c);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_156c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1558,(ulong)local_156c)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1578);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1580);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1578 / local_1580);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2010]\n");
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
  ::markov<bcl::st2010,std::vector<double,std::allocator<double>>>
            ((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)in_stack_ffffffffffffe5d0,(st2010 *)in_stack_ffffffffffffe5c8,
             (vector<double,_std::allocator<double>_> *)0x103743);
  local_15c8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x103766);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x103797);
  for (local_15d0 = 0; local_15d0 < 10000000; local_15d0 = local_15d0 + 1) {
    sVar3 = bcl::markov_impl<unsigned_long>::operator()
                      ((markov_impl<unsigned_long> *)in_stack_ffffffffffffe5d0,
                       (state_type)in_stack_ffffffffffffe5c8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)0x1037d0);
    local_142c = (int)sVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_15c0,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_15d4 = 0; local_15d4 < 2; local_15d4 = local_15d4 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_15d4);
    pvVar6 = local_15c0;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_15d4);
    std::abs((int)pvVar6);
    local_15e0 = extraout_XMM0_Qa_03;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_15c0,(ulong)local_15d4);
    local_15e8 = sqrt(*pvVar4);
    local_15e8 = local_15e8 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_15d4);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_15d4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_15c0,(ulong)local_15d4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_15e0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_15e8);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_15e0 / local_15e8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::~markov((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
             *)0x103b32);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2010 (choose_next)]\n");
  local_1608 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x103b68);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x103b99);
  for (local_1610 = 0; local_1610 < 10000000; local_1610 = local_1610 + 1) {
    sVar5 = bcl::st2010::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (in_stack_ffffffffffffe638,in_stack_ffffffffffffe630,in_stack_ffffffffffffe628
                      );
    local_142c = (int)sVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1600,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_1614 = 0; local_1614 < 2; local_1614 = local_1614 + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_1614);
    pvVar6 = &local_1600;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_1614);
    std::abs((int)pvVar6);
    local_1620 = extraout_XMM0_Qa_04;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1600,(ulong)local_1614)
    ;
    local_1628 = sqrt(*pvVar4);
    local_1628 = local_1628 / 10000000.0;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1614);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_1614);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_1600,(ulong)local_1614)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1620);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1628);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1620 / local_1628);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  std::operator<<((ostream *)&std::cout,"[Suwa-Todo 2013]\n");
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
  ::markov<bcl::st2013,std::vector<double,std::allocator<double>>>
            ((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
              *)in_stack_ffffffffffffe5d0,(st2013 *)in_stack_ffffffffffffe5c8,
             (vector<double,_std::allocator<double>_> *)0x103f6b);
  std::allocator<double>::allocator((allocator<double> *)0x103f8e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8,
             in_stack_ffffffffffffe5e0._M_current,
             (allocator_type *)in_stack_ffffffffffffe5d8._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x103fbf);
  for (local_1678 = 0; local_1678 < 10000000; local_1678 = local_1678 + 1) {
    sVar3 = bcl::markov_impl<unsigned_long>::operator()
                      ((markov_impl<unsigned_long> *)in_stack_ffffffffffffe5d0,
                       (state_type)in_stack_ffffffffffffe5c8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)0x103ff8);
    local_142c = (int)sVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1668,(long)local_142c);
    *pvVar4 = *pvVar4 + 1.0;
  }
  std::operator<<((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n");
  for (local_167c = 0; local_167c < 2; local_167c = local_167c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_167c);
    pvVar6 = local_1668;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(ulong)local_167c);
    std::abs((int)pvVar6);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1668,(ulong)local_167c);
    dVar8 = sqrt(*pvVar4);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_167c);
    poVar2 = std::operator<<(poVar2,"\t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,(ulong)local_167c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / local_13f8);
    poVar2 = std::operator<<(poVar2,"    \t");
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_1668,(ulong)local_167c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4 / 10000000.0);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,extraout_XMM0_Qa_05);
    poVar2 = std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar8 / 10000000.0);
    in_stack_ffffffffffffe5e0._M_current = (double *)std::operator<<(poVar2,"    \t");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)in_stack_ffffffffffffe5e0._M_current,
                        extraout_XMM0_Qa_05 / (dVar8 / 10000000.0));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  bcl::
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ::~markov((markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
             *)0x104306);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe5e0._M_current);
  return local_4;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;
  std::cout << "number of samples = " << samples << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = 1.0 + 0.001 * dist(eng);
  double total = std::accumulate(weights.begin(), weights.end(), 0.0);
  std::cout << "[weights]\n";
  for (auto& w : weights) std::cout << w << ' ';
  std::cout << std::endl;

  // generate markov chain
  int x = 0;
  {
    std::cout << "[Metropolis]\n";
    bcl::markov<engine_type> mc(bcl::metropolis(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Metropolis (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::metropolis::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath]\n";
    bcl::markov<engine_type> mc(bcl::heatbath(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::heatbath::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010]\n";
    bcl::markov<engine_type> mc(bcl::st2010(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010 (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::st2010::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2013]\n";
    bcl::markov<engine_type> mc(bcl::st2013(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}